

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O3

word Ifn_NtkMatchCollectPerm(Ifn_Ntk_t *p,sat_solver *pSat)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  word wVar7;
  
  iVar1 = p->nParsVNum;
  if (iVar1 < 5) {
    iVar4 = p->nInps;
    iVar5 = 0;
    wVar7 = 0;
    if (0 < iVar4) {
      do {
        if (iVar1 < 1) {
          lVar3 = 0;
        }
        else {
          uVar6 = 0;
          iVar4 = 0;
          do {
            iVar1 = sat_solver_var_value(pSat,iVar1 * iVar5 + p->nParsVIni + iVar4);
            uVar2 = 1 << ((byte)iVar4 & 0x1f);
            if (iVar1 == 0) {
              uVar2 = 0;
            }
            uVar6 = uVar6 | uVar2;
            iVar4 = iVar4 + 1;
            iVar1 = p->nParsVNum;
          } while (iVar4 < iVar1);
          iVar4 = p->nInps;
          lVar3 = (long)(int)uVar6;
        }
        wVar7 = wVar7 | lVar3 << ((char)iVar5 * '\x04' & 0x3fU);
        iVar5 = iVar5 + 1;
      } while (iVar5 < iVar4);
    }
    return wVar7;
  }
  __assert_fail("p->nParsVNum <= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifTune.c"
                ,0x50f,"word Ifn_NtkMatchCollectPerm(Ifn_Ntk_t *, sat_solver *)");
}

Assistant:

word Ifn_NtkMatchCollectPerm( Ifn_Ntk_t * p, sat_solver * pSat )
{
    word Perm = 0;
    int i, v, Mint;
    assert( p->nParsVNum <= 4 );
    for ( i = 0; i < p->nInps; i++ )
    {
        for ( Mint = v = 0; v < p->nParsVNum; v++ )
            if ( sat_solver_var_value(pSat, p->nParsVIni + i * p->nParsVNum + v) )
                Mint |= (1 << v);
        Abc_TtSetHex( &Perm, i, Mint );
    }
    return Perm;
}